

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

void dynamic_resize_one_pass_cbr(AV1_COMP *cpi)

{
  long lVar1;
  int iVar2;
  long *in_RDI;
  bool bVar3;
  int resize_scale_den;
  int resize_scale_num;
  int resize_height;
  int resize_width;
  int avg_qp;
  int window;
  int down_size_on;
  int min_height;
  int min_width;
  int avg_qp_thr2;
  int avg_qp_thr1;
  RESIZE_ACTION resize_action;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  AV1_COMMON *cm;
  int local_54;
  uint local_24;
  
  lVar1 = *in_RDI;
  local_24 = 0;
  if (*(char *)&((AV1_COMP *)(in_RDI + 0x77f0))->ppi == '\0') {
    *(undefined4 *)((long)in_RDI + 0x60864) = 0;
    *(undefined4 *)((long)in_RDI + 0x6086c) = 0;
    *(undefined4 *)(in_RDI + 0xc10d) = 0;
  }
  else {
    if ((double)in_RDI[0xc116] <= (double)(int)in_RDI[0xc0f4] &&
        (double)(int)in_RDI[0xc0f4] != (double)in_RDI[0xc116]) {
      if ((int)((double)in_RDI[0xc116] * 2.0) < 0x1f) {
        local_54 = (int)((double)in_RDI[0xc116] * 2.0);
      }
      else {
        local_54 = 0x1e;
      }
      *(int *)((long)in_RDI + 0x60864) = *(int *)(lVar1 + 0xacfc) + *(int *)((long)in_RDI + 0x60864)
      ;
      if (*(long *)(*in_RDI + 0xad38) < (long)(int)((*(long *)(lVar1 + 0xac78) * 0x1e) / 100)) {
        *(int *)(in_RDI + 0xc10d) = (int)in_RDI[0xc10d] + 1;
      }
      *(int *)((long)in_RDI + 0x6086c) = *(int *)((long)in_RDI + 0x6086c) + 1;
      if (local_54 <= *(int *)((long)in_RDI + 0x6086c)) {
        iVar2 = *(int *)((long)in_RDI + 0x60864) / *(int *)((long)in_RDI + 0x6086c);
        if ((*(int *)((long)in_RDI + 0x6086c) >> 2 < (int)in_RDI[0xc10d]) &&
           (0x63d7 < (int)in_RDI[0x77f7] * *(int *)((long)in_RDI + 0x3bfbc))) {
          if ((int)in_RDI[0xc10c] == 1) {
            local_24 = 2;
            *(undefined4 *)(in_RDI + 0xc10c) = 2;
          }
          else {
            bVar3 = (int)in_RDI[0xc10c] == 0;
            if (bVar3) {
              *(undefined4 *)(in_RDI + 0xc10c) = 1;
            }
            local_24 = (uint)bVar3;
          }
        }
        else if (((int)in_RDI[0xc10c] != 0) &&
                (iVar2 < (*(int *)((long)in_RDI + 0x6082c) * 0x46) / 100)) {
          if (((int)in_RDI[0xc10c] == 1) ||
             (iVar2 < (*(int *)((long)in_RDI + 0x6082c) * 0x32) / 100)) {
            local_24 = 0xfffffffe;
            *(undefined4 *)(in_RDI + 0xc10c) = 0;
          }
          else if ((int)in_RDI[0xc10c] == 2) {
            local_24 = 0xffffffff;
            *(undefined4 *)(in_RDI + 0xc10c) = 1;
          }
        }
        *(undefined4 *)((long)in_RDI + 0x60864) = 0;
        *(undefined4 *)((long)in_RDI + 0x6086c) = 0;
        *(undefined4 *)(in_RDI + 0xc10d) = 0;
      }
    }
    if (local_24 != 0) {
      resize_reset_rc((AV1_COMP *)(in_RDI + 0x77f0),(int)((ulong)(in_RDI + 0xc0ee) >> 0x20),
                      (int)(in_RDI + 0xc0ee),(int)((ulong)(lVar1 + 0x8b30) >> 0x20),
                      (int)(lVar1 + 0x8b30));
    }
  }
  return;
}

Assistant:

static void dynamic_resize_one_pass_cbr(AV1_COMP *cpi) {
  const AV1_COMMON *const cm = &cpi->common;
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  RESIZE_ACTION resize_action = NO_RESIZE;
  const int avg_qp_thr1 = 70;
  const int avg_qp_thr2 = 50;
  // Don't allow for resized frame to go below 160x90, resize in steps of 3/4.
  const int min_width = (160 * 4) / 3;
  const int min_height = (90 * 4) / 3;
  int down_size_on = 1;
  // Don't resize on key frame; reset the counters on key frame.
  if (cm->current_frame.frame_type == KEY_FRAME) {
    rc->resize_avg_qp = 0;
    rc->resize_count = 0;
    rc->resize_buffer_underflow = 0;
    return;
  }
  // No resizing down if frame size is below some limit.
  if ((cm->width * cm->height) < min_width * min_height) down_size_on = 0;

  // Resize based on average buffer underflow and QP over some window.
  // Ignore samples close to key frame, since QP is usually high after key.
  if (cpi->rc.frames_since_key > cpi->framerate) {
    const int window = AOMMIN(30, (int)(2 * cpi->framerate));
    rc->resize_avg_qp += p_rc->last_q[INTER_FRAME];
    if (cpi->ppi->p_rc.buffer_level <
        (int)(30 * p_rc->optimal_buffer_level / 100))
      ++rc->resize_buffer_underflow;
    ++rc->resize_count;
    // Check for resize action every "window" frames.
    if (rc->resize_count >= window) {
      int avg_qp = rc->resize_avg_qp / rc->resize_count;
      // Resize down if buffer level has underflowed sufficient amount in past
      // window, and we are at original or 3/4 of original resolution.
      // Resize back up if average QP is low, and we are currently in a resized
      // down state, i.e. 1/2 or 3/4 of original resolution.
      // Currently, use a flag to turn 3/4 resizing feature on/off.
      if (rc->resize_buffer_underflow > (rc->resize_count >> 2) &&
          down_size_on) {
        if (rc->resize_state == THREE_QUARTER) {
          resize_action = DOWN_ONEHALF;
          rc->resize_state = ONE_HALF;
        } else if (rc->resize_state == ORIG) {
          resize_action = DOWN_THREEFOUR;
          rc->resize_state = THREE_QUARTER;
        }
      } else if (rc->resize_state != ORIG &&
                 avg_qp < avg_qp_thr1 * cpi->rc.worst_quality / 100) {
        if (rc->resize_state == THREE_QUARTER ||
            avg_qp < avg_qp_thr2 * cpi->rc.worst_quality / 100) {
          resize_action = UP_ORIG;
          rc->resize_state = ORIG;
        } else if (rc->resize_state == ONE_HALF) {
          resize_action = UP_THREEFOUR;
          rc->resize_state = THREE_QUARTER;
        }
      }
      // Reset for next window measurement.
      rc->resize_avg_qp = 0;
      rc->resize_count = 0;
      rc->resize_buffer_underflow = 0;
    }
  }
  // If decision is to resize, reset some quantities, and check is we should
  // reduce rate correction factor,
  if (resize_action != NO_RESIZE) {
    int resize_width = cpi->oxcf.frm_dim_cfg.width;
    int resize_height = cpi->oxcf.frm_dim_cfg.height;
    int resize_scale_num = 1;
    int resize_scale_den = 1;
    if (resize_action == DOWN_THREEFOUR || resize_action == UP_THREEFOUR) {
      resize_scale_num = 3;
      resize_scale_den = 4;
    } else if (resize_action == DOWN_ONEHALF) {
      resize_scale_num = 1;
      resize_scale_den = 2;
    }
    resize_width = resize_width * resize_scale_num / resize_scale_den;
    resize_height = resize_height * resize_scale_num / resize_scale_den;
    resize_reset_rc(cpi, resize_width, resize_height, cm->width, cm->height);
  }
  return;
}